

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

NAMED * lookup(XML_Parser parser,HASH_TABLE *table,KEY name,size_t createSize)

{
  byte bVar1;
  unsigned_long uVar2;
  size_t sVar3;
  NAMED *pNVar4;
  NAMED **ppNVar5;
  unsigned_long uVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  long lVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  size_t __n;
  
  if (table->size == 0) {
    if (createSize == 0) {
      return (NAMED *)0x0;
    }
    table->power = '\x06';
    table->size = 0x40;
    ppNVar5 = (NAMED **)(*table->mem->malloc_fcn)(0x200);
    table->v = ppNVar5;
    if (ppNVar5 == (NAMED **)0x0) {
      table->size = 0;
      return (NAMED *)0x0;
    }
    memset(ppNVar5,0,0x200);
    uVar2 = hash(parser,name);
    uVar14 = table->size - 1 & uVar2;
  }
  else {
    uVar2 = hash(parser,name);
    sVar12 = table->size;
    bVar10 = 0;
    for (uVar14 = sVar12 - 1 & uVar2; pNVar4 = table->v[uVar14], pNVar4 != (NAMED *)0x0;
        uVar14 = (uVar14 - bVar10) + sVar3) {
      for (lVar11 = 0; name[lVar11] == pNVar4->name[lVar11]; lVar11 = lVar11 + 1) {
        if (name[lVar11] == '\0') {
          return pNVar4;
        }
      }
      if (bVar10 == 0) {
        bVar10 = (byte)((-sVar12 & uVar2) >> ((char)*(undefined4 *)&table->power - 1U & 0x3f)) &
                 (byte)(sVar12 - 1 >> 2) | 1;
      }
      sVar3 = 0;
      if (uVar14 < bVar10) {
        sVar3 = sVar12;
      }
    }
    if (createSize == 0) {
      return (NAMED *)0x0;
    }
    bVar10 = (byte)*(undefined4 *)&table->power;
    if (table->used >> (bVar10 - 1 & 0x3f) != 0) {
      bVar9 = bVar10 + 1;
      sVar12 = 1L << (bVar9 & 0x3f);
      __n = 8L << (bVar9 & 0x3f);
      ppNVar5 = (NAMED **)(*table->mem->malloc_fcn)(__n);
      if (ppNVar5 == (NAMED **)0x0) {
        return (NAMED *)0x0;
      }
      uVar14 = sVar12 - 1;
      memset(ppNVar5,0,__n);
      for (uVar13 = 0; bVar1 = (byte)(uVar14 >> 2), uVar13 < table->size; uVar13 = uVar13 + 1) {
        if (table->v[uVar13] != (NAMED *)0x0) {
          uVar6 = hash(parser,table->v[uVar13]->name);
          uVar7 = 0;
          for (uVar8 = uVar6 & uVar14; ppNVar5[uVar8] != (NAMED *)0x0;
              uVar8 = (uVar8 - uVar7) + sVar3) {
            if ((char)uVar7 == '\0') {
              uVar7 = (ulong)(byte)(bVar1 & (byte)((uVar6 & -sVar12) >> (bVar10 & 0x3f)) | 1);
            }
            sVar3 = 0;
            if (uVar8 < uVar7) {
              sVar3 = sVar12;
            }
          }
          ppNVar5[uVar8] = table->v[uVar13];
        }
      }
      (*table->mem->free_fcn)(table->v);
      table->v = ppNVar5;
      table->power = bVar9;
      table->size = sVar12;
      uVar13 = 0;
      for (uVar14 = uVar14 & uVar2; ppNVar5[uVar14] != (NAMED *)0x0;
          uVar14 = (uVar14 - uVar13) + sVar3) {
        if ((char)uVar13 == '\0') {
          uVar13 = (ulong)(byte)(bVar1 & (byte)((-sVar12 & uVar2) >> (bVar10 & 0x3f)) | 1);
        }
        sVar3 = 0;
        if (uVar14 < uVar13) {
          sVar3 = sVar12;
        }
      }
    }
  }
  pNVar4 = (NAMED *)(*table->mem->malloc_fcn)(createSize);
  table->v[uVar14] = pNVar4;
  if (table->v[uVar14] == (NAMED *)0x0) {
    return (NAMED *)0x0;
  }
  memset(table->v[uVar14],0,createSize);
  ppNVar5 = table->v;
  ppNVar5[uVar14]->name = name;
  table->used = table->used + 1;
  return ppNVar5[uVar14];
}

Assistant:

static NAMED *
lookup(XML_Parser parser, HASH_TABLE *table, KEY name, size_t createSize)
{
  size_t i;
  if (table->size == 0) {
    size_t tsize;
    if (!createSize)
      return NULL;
    table->power = INIT_POWER;
    /* table->size is a power of 2 */
    table->size = (size_t)1 << INIT_POWER;
    tsize = table->size * sizeof(NAMED *);
    table->v = (NAMED **)table->mem->malloc_fcn(tsize);
    if (!table->v) {
      table->size = 0;
      return NULL;
    }
    memset(table->v, 0, tsize);
    i = hash(parser, name) & ((unsigned long)table->size - 1);
  }
  else {
    unsigned long h = hash(parser, name);
    unsigned long mask = (unsigned long)table->size - 1;
    unsigned char step = 0;
    i = h & mask;
    while (table->v[i]) {
      if (keyeq(name, table->v[i]->name))
        return table->v[i];
      if (!step)
        step = PROBE_STEP(h, mask, table->power);
      i < step ? (i += table->size - step) : (i -= step);
    }
    if (!createSize)
      return NULL;

    /* check for overflow (table is half full) */
    if (table->used >> (table->power - 1)) {
      unsigned char newPower = table->power + 1;
      size_t newSize = (size_t)1 << newPower;
      unsigned long newMask = (unsigned long)newSize - 1;
      size_t tsize = newSize * sizeof(NAMED *);
      NAMED **newV = (NAMED **)table->mem->malloc_fcn(tsize);
      if (!newV)
        return NULL;
      memset(newV, 0, tsize);
      for (i = 0; i < table->size; i++)
        if (table->v[i]) {
          unsigned long newHash = hash(parser, table->v[i]->name);
          size_t j = newHash & newMask;
          step = 0;
          while (newV[j]) {
            if (!step)
              step = PROBE_STEP(newHash, newMask, newPower);
            j < step ? (j += newSize - step) : (j -= step);
          }
          newV[j] = table->v[i];
        }
      table->mem->free_fcn(table->v);
      table->v = newV;
      table->power = newPower;
      table->size = newSize;
      i = h & newMask;
      step = 0;
      while (table->v[i]) {
        if (!step)
          step = PROBE_STEP(h, newMask, newPower);
        i < step ? (i += newSize - step) : (i -= step);
      }
    }
  }
  table->v[i] = (NAMED *)table->mem->malloc_fcn(createSize);
  if (!table->v[i])
    return NULL;
  memset(table->v[i], 0, createSize);
  table->v[i]->name = name;
  (table->used)++;
  return table->v[i];
}